

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly1,
          MP<8UL,_GF2::MOGrevlex<8UL>_> *poly2)

{
  bool bVar1;
  MM<8UL> *this_00;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *this_01;
  MM<8UL> *mRight;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *this_02;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *this_03;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  const_iterator iter;
  MM<8UL> m;
  MM<8UL> lm;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffff78;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff80;
  MM<8UL> *in_stack_ffffffffffffff88;
  MM<8UL> *in_stack_ffffffffffffff90;
  _Self local_50;
  _List_node_base *local_48;
  _Self local_40;
  _List_node_base *local_38;
  _List_const_iterator<GF2::MM<8UL>_> local_30 [2];
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffffe0;
  
  MM<8UL>::MM((MM<8UL> *)0x1d54a0);
  MM<8UL>::MM((MM<8UL> *)0x1d54aa);
  std::_List_const_iterator<GF2::MM<8UL>_>::_List_const_iterator(local_30);
  SetEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d54be);
  LM(in_stack_ffffffffffffff80);
  this_00 = LM(in_stack_ffffffffffffff80);
  LM(in_stack_ffffffffffffff80);
  MM<8UL>::LCM(this_00,(MM<8UL> *)in_RDI,in_stack_ffffffffffffff90);
  MM<8UL>::operator/=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_38 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                       (in_stack_ffffffffffffff78);
  local_30[0]._M_node = local_38;
  while( true ) {
    this_01 = (list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
              std::_List_const_iterator<GF2::MM<8UL>_>::operator++(local_30);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                   (in_stack_ffffffffffffff78);
    bVar1 = std::operator!=((_Self *)this_01,&local_40);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1d555b);
    MM<8UL>::operator=((MM<8UL> *)in_stack_ffffffffffffff80,(MM<8UL> *)in_stack_ffffffffffffff78);
    MM<8ul>::operator*=((MM<8UL> *)in_stack_ffffffffffffff80,(MM<8UL> *)in_stack_ffffffffffffff78);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
              (this_01,in_stack_ffffffffffffff88);
  }
  mRight = LM(in_stack_ffffffffffffff80);
  this_02 = (MP<8UL,_GF2::MOGrevlex<8UL>_> *)LM(in_stack_ffffffffffffff80);
  LM(this_02);
  MM<8UL>::LCM(this_00,(MM<8UL> *)in_RDI,(MM<8UL> *)this_01);
  MM<8UL>::operator/=((MM<8UL> *)this_01,mRight);
  local_48 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                       (in_stack_ffffffffffffff78);
  local_30[0]._M_node = local_48;
  while( true ) {
    this_03 = (list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
              std::_List_const_iterator<GF2::MM<8UL>_>::operator++(local_30);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end(this_03);
    bVar1 = std::operator!=((_Self *)this_03,&local_50);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1d561f);
    MM<8UL>::operator=((MM<8UL> *)this_02,(MM<8UL> *)this_03);
    MM<8ul>::operator*=((MM<8UL> *)this_02,(MM<8UL> *)this_03);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back(this_01,mRight);
  }
  Normalize(in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}